

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::HeapEntry<duckdb::string_t>::HeapEntry
          (HeapEntry<duckdb::string_t> *this,HeapEntry<duckdb::string_t> *other)

{
  uint uVar1;
  data_ptr_t __src;
  char *pcVar2;
  data_ptr_t *ppdVar3;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 local_20;
  
  if ((other->value).value.pointer.length < 0xd) {
    pcVar2 = (other->value).value.pointer.ptr;
    *(undefined8 *)&(this->value).value = *(undefined8 *)&(other->value).value;
    (this->value).value.pointer.ptr = pcVar2;
    this->capacity = 0;
    ppdVar3 = &this->allocated_data;
  }
  else {
    this->capacity = other->capacity;
    __src = other->allocated_data;
    this->allocated_data = __src;
    uVar1 = (other->value).value.pointer.length;
    if ((ulong)uVar1 < 0xd) {
      local_20 = 0;
      local_28 = 0;
      uStack_24 = 0;
      if (uVar1 != 0) {
        memcpy(&local_28,__src,(ulong)uVar1);
      }
    }
    else {
      local_28 = *(undefined4 *)__src;
      uStack_24 = SUB84(__src,0);
      local_20 = (undefined4)((ulong)__src >> 0x20);
    }
    ppdVar3 = &other->allocated_data;
    (this->value).value.pointer.length = uVar1;
    *(ulong *)((long)&(this->value).value + 4) = CONCAT44(uStack_24,local_28);
    *(undefined4 *)((long)&(this->value).value + 0xc) = local_20;
  }
  *ppdVar3 = (data_ptr_t)0x0;
  return;
}

Assistant:

HeapEntry(HeapEntry &&other) noexcept {
		if (other.value.IsInlined()) {
			value = other.value;
			capacity = 0;
			allocated_data = nullptr;
		} else {
			capacity = other.capacity;
			allocated_data = other.allocated_data;
			value = string_t(const_char_ptr_cast(allocated_data), UnsafeNumericCast<uint32_t>(other.value.GetSize()));
			other.allocated_data = nullptr;
		}
	}